

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void statement(LexState *ls)

{
  Labellist *l;
  unsigned_short *puVar1;
  byte bVar2;
  byte bVar3;
  FuncState *fs;
  Dyndata *pDVar4;
  Instruction *pIVar5;
  int iVar6;
  expkind list;
  int iVar7;
  int iVar8;
  int iVar9;
  uint first;
  TString *pTVar10;
  TString *pTVar11;
  ushort uVar12;
  long lVar13;
  uint uVar14;
  char *pcVar15;
  FuncState *pFVar16;
  long lVar17;
  expdesc v;
  undefined1 local_78 [8];
  expdesc local_70;
  FuncState *local_58;
  FuncState *local_50;
  BlockCnt *local_48;
  anon_union_8_3_d9ba1464_for_u local_40 [2];
  
  iVar8 = ls->linenumber;
  uVar12 = ls->L->nCcalls + 1;
  ls->L->nCcalls = uVar12;
  if (200 < uVar12) {
    errorlimit(ls->fs,200,"C levels");
  }
  iVar6 = (ls->t).token;
  switch(iVar6) {
  case 0x102:
  case 0x10a:
    iVar8 = luaK_jump(ls->fs);
    gotostat(ls,iVar8);
    break;
  case 0x103:
    luaX_next(ls);
    block(ls);
    check_match(ls,0x106,0x103,iVar8);
    break;
  case 0x108:
    pFVar16 = ls->fs;
    local_40[0]._4_1_ = pFVar16->nactvar;
    pDVar4 = pFVar16->ls->dyd;
    local_40[0]._0_2_ = (undefined2)(pDVar4->label).n;
    local_40[0]._2_2_ = (undefined2)(pDVar4->gt).n;
    local_40[0]._5_1_ = '\0';
    local_40[0]._6_1_ = '\x01';
    local_48 = pFVar16->bl;
    pFVar16->bl = (BlockCnt *)&local_48;
    luaX_next(ls);
    pTVar11 = str_checkname(ls);
    iVar6 = (ls->t).token;
    if ((iVar6 == 0x2c) || (iVar6 == 0x10c)) {
      local_50 = ls->fs;
      local_58 = (FuncState *)CONCAT44(local_58._4_4_,(uint)local_50->freereg);
      pTVar10 = luaX_newstring(ls,"(for generator)",0xf);
      new_localvar(ls,pTVar10);
      pTVar10 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar10);
      pTVar10 = luaX_newstring(ls,"(for control)",0xd);
      new_localvar(ls,pTVar10);
      new_localvar(ls,pTVar11);
      iVar6 = 1;
      while ((ls->t).token == 0x2c) {
        luaX_next(ls);
        pTVar11 = str_checkname(ls);
        new_localvar(ls,pTVar11);
        iVar6 = iVar6 + 1;
      }
      checknext(ls,0x10c);
      iVar7 = ls->linenumber;
      iVar9 = explist(ls,(expdesc *)local_78);
      adjust_assign(ls,3,iVar9,(expdesc *)local_78);
      luaK_checkstack(local_50,3);
      iVar9 = 0;
      uVar14 = (uint)local_58;
    }
    else {
      if (iVar6 != 0x3d) {
        pcVar15 = "\'=\' or \'in\' expected";
        goto LAB_0010d9d3;
      }
      fs = ls->fs;
      bVar2 = fs->freereg;
      pTVar10 = luaX_newstring(ls,"(for index)",0xb);
      new_localvar(ls,pTVar10);
      pTVar10 = luaX_newstring(ls,"(for limit)",0xb);
      new_localvar(ls,pTVar10);
      pTVar10 = luaX_newstring(ls,"(for step)",10);
      new_localvar(ls,pTVar10);
      new_localvar(ls,pTVar11);
      checknext(ls,0x3d);
      subexpr(ls,(expdesc *)local_78,0);
      luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      checknext(ls,0x2c);
      subexpr(ls,(expdesc *)local_78,0);
      luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      if ((ls->t).token == 0x2c) {
        luaX_next(ls);
        subexpr(ls,(expdesc *)local_78,0);
        luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      }
      else {
        bVar3 = fs->freereg;
        iVar6 = luaK_numberK(fs,1.0);
        luaK_codek(fs,(uint)bVar3,iVar6);
        luaK_reserveregs(fs,1);
      }
      iVar6 = 1;
      iVar9 = 1;
      uVar14 = (uint)bVar2;
      iVar7 = iVar8;
    }
    forbody(ls,uVar14,iVar7,iVar6,iVar9);
    check_match(ls,0x106,0x108,iVar8);
    goto LAB_0010d928;
  case 0x109:
    luaX_next(ls);
    singlevar(ls,(expdesc *)local_78);
    while (iVar6 = (ls->t).token, iVar6 == 0x2e) {
      fieldsel(ls,(expdesc *)local_78);
    }
    if (iVar6 == 0x3a) {
      fieldsel(ls,(expdesc *)local_78);
    }
    body(ls,(expdesc *)&local_48,(uint)(iVar6 == 0x3a),iVar8);
    luaK_storevar(ls->fs,(expdesc *)local_78,(expdesc *)&local_48);
    luaK_fixline(ls->fs,iVar8);
    break;
  case 0x10b:
    pFVar16 = ls->fs;
    local_78._0_4_ = 0xffffffff;
    do {
      test_then_block(ls,(int *)local_78);
      iVar6 = (ls->t).token;
    } while (iVar6 == 0x105);
    if (iVar6 == 0x104) {
      luaX_next(ls);
      block(ls);
    }
    check_match(ls,0x106,0x10b,iVar8);
    list = local_78._0_4_;
    goto LAB_0010d5b7;
  case 0x10d:
    luaX_next(ls);
    if ((ls->t).token == 0x109) {
      luaX_next(ls);
      pFVar16 = ls->fs;
      pTVar11 = str_checkname(ls);
      new_localvar(ls,pTVar11);
      adjustlocalvars(ls,1);
      body(ls,(expdesc *)local_78,0,ls->linenumber);
      pFVar16->f->locvars
      [(pFVar16->ls->dyd->actvar).arr[(long)pFVar16->firstlocal + (long)(int)local_70.k].idx].
      startpc = pFVar16->pc;
    }
    else {
      pTVar11 = str_checkname(ls);
      new_localvar(ls,pTVar11);
      iVar8 = 1;
      while ((ls->t).token == 0x2c) {
        luaX_next(ls);
        pTVar11 = str_checkname(ls);
        new_localvar(ls,pTVar11);
        iVar8 = iVar8 + 1;
      }
      if ((ls->t).token == 0x3d) {
        luaX_next(ls);
        iVar6 = explist(ls,(expdesc *)local_78);
      }
      else {
        local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffff00000000);
        iVar6 = 0;
      }
      adjust_assign(ls,iVar8,iVar6,(expdesc *)local_78);
      adjustlocalvars(ls,iVar8);
    }
    break;
  case 0x111:
    pFVar16 = ls->fs;
    iVar6 = luaK_getlabel(pFVar16);
    local_70._6_1_ = 1;
    local_70._4_1_ = pFVar16->nactvar;
    pDVar4 = pFVar16->ls->dyd;
    local_40[0]._0_2_ = (undefined2)(pDVar4->label).n;
    local_40[0]._2_2_ = (undefined2)(pDVar4->gt).n;
    local_70.k = CONCAT22(local_40[0]._2_2_,local_40[0]._0_2_);
    local_70._5_1_ = 0;
    local_78 = (undefined1  [8])pFVar16->bl;
    pFVar16->bl = (BlockCnt *)local_78;
    local_40[0]._5_1_ = '\0';
    local_40[0]._6_1_ = '\0';
    pFVar16->bl = (BlockCnt *)&local_48;
    local_48 = (BlockCnt *)local_78;
    local_40[0]._4_1_ = local_70._4_1_;
    luaX_next(ls);
    statlist(ls);
    check_match(ls,0x115,0x111,iVar8);
    iVar8 = cond(ls);
    if (local_40[0]._5_1_ != '\0') {
      luaK_patchclose(pFVar16,iVar8,(uint)(byte)local_40[0]._4_1_);
    }
    leaveblock(pFVar16);
    luaK_patchlist(pFVar16,iVar8,iVar6);
LAB_0010d928:
    leaveblock(pFVar16);
    break;
  case 0x112:
    luaX_next(ls);
    iVar8 = (ls->t).token;
    uVar14 = iVar8 - 0x104;
    pFVar16 = ls->fs;
    first = 0;
    if (iVar8 == 0x3b) {
      iVar8 = 0;
    }
    else {
      iVar8 = 0;
      first = 0;
      if ((uVar14 < 0x1b & (byte)(0x4020007 >> ((byte)uVar14 & 0x1f))) == 0) {
        iVar8 = explist(ls,(expdesc *)local_78);
        if ((local_78._0_4_ & ~VNIL) == VCALL) {
          luaK_setreturns(pFVar16,(expdesc *)local_78,-1);
          if (iVar8 == 1 && local_78._0_4_ == VCALL) {
            pIVar5 = pFVar16->f->code;
            pIVar5[(int)local_70.k] = pIVar5[(int)local_70.k] & 0xffffffc0 | 0x1e;
          }
          first = (uint)pFVar16->nactvar;
          iVar8 = -1;
        }
        else if (iVar8 == 1) {
          first = luaK_exp2anyreg(pFVar16,(expdesc *)local_78);
          iVar8 = 1;
        }
        else {
          luaK_exp2nextreg(pFVar16,(expdesc *)local_78);
          first = (uint)pFVar16->nactvar;
        }
      }
    }
    luaK_ret(pFVar16,first,iVar8);
    if ((ls->t).token != 0x3b) break;
LAB_0010d94f:
    luaX_next(ls);
    break;
  case 0x116:
    pFVar16 = ls->fs;
    luaX_next(ls);
    iVar6 = luaK_getlabel(pFVar16);
    list = cond(ls);
    local_70._6_1_ = 1;
    local_70._4_1_ = pFVar16->nactvar;
    pDVar4 = pFVar16->ls->dyd;
    local_70.k = CONCAT22((short)(pDVar4->gt).n,(short)(pDVar4->label).n);
    local_70._5_1_ = 0;
    local_78 = (undefined1  [8])pFVar16->bl;
    pFVar16->bl = (BlockCnt *)local_78;
    checknext(ls,0x103);
    block(ls);
    iVar7 = luaK_jump(pFVar16);
    luaK_patchlist(pFVar16,iVar7,iVar6);
    check_match(ls,0x106,0x116,iVar8);
    leaveblock(pFVar16);
LAB_0010d5b7:
    luaK_patchtohere(pFVar16,list);
    break;
  default:
    if (iVar6 == 0x11d) {
      local_50 = (FuncState *)CONCAT44(local_50._4_4_,iVar8);
      luaX_next(ls);
      pTVar11 = str_checkname(ls);
      local_58 = ls->fs;
      pDVar4 = ls->dyd;
      l = &pDVar4->label;
      iVar8 = (int)local_58->bl->firstlabel;
      if (iVar8 < (pDVar4->label).n) {
        lVar13 = (long)iVar8;
        lVar17 = lVar13 * 0x18;
        do {
          iVar8 = luaS_eqstr(pTVar11,*(TString **)((long)&l->arr->name + lVar17));
          pFVar16 = local_58;
          if (iVar8 != 0) {
            pcVar15 = luaO_pushfstring(local_58->ls->L,"label \'%s\' already defined on line %d",
                                       pTVar11 + 1,(ulong)*(uint *)((long)&l->arr->line + lVar17));
            semerror(pFVar16->ls,pcVar15);
          }
          lVar13 = lVar13 + 1;
          lVar17 = lVar17 + 0x18;
        } while (lVar13 < (pDVar4->label).n);
      }
      checknext(ls,0x11d);
      pFVar16 = local_58;
      iVar8 = newlabelentry(ls,l,pTVar11,(int)local_50,local_58->pc);
      do {
        iVar6 = (ls->t).token;
        if (iVar6 < 0x11d) {
          if (iVar6 != 0x3b) goto LAB_0010d77b;
        }
        else if (iVar6 != 0x11d) {
          if (iVar6 != 0x11e) goto LAB_0010d79b;
          goto LAB_0010d785;
        }
        statement(ls);
      } while( true );
    }
    if (iVar6 == 0x3b) goto LAB_0010d94f;
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x107:
  case 0x10c:
  case 0x10e:
  case 0x10f:
  case 0x110:
  case 0x113:
  case 0x114:
  case 0x115:
    pFVar16 = ls->fs;
    suffixedexp(ls,&local_70);
    iVar8 = (ls->t).token;
    if ((iVar8 == 0x3d) || (iVar8 == 0x2c)) {
      local_78 = (undefined1  [8])0x0;
      assignment(ls,(LHS_assign *)local_78,1);
    }
    else {
      if (local_70.k != VCALL) {
        pcVar15 = "syntax error";
LAB_0010d9d3:
        luaX_syntaxerror(ls,pcVar15);
      }
      pIVar5 = pFVar16->f->code;
      pIVar5[local_70.u.info] = pIVar5[local_70.u.info] & 0xff803fff | 0x4000;
    }
  }
LAB_0010d957:
  ls->fs->freereg = ls->fs->nactvar;
  puVar1 = &ls->L->nCcalls;
  *puVar1 = *puVar1 - 1;
  return;
LAB_0010d77b:
  if (iVar6 - 0x104U < 3) {
LAB_0010d785:
    l->arr[iVar8].nactvar = pFVar16->bl->nactvar;
  }
LAB_0010d79b:
  findgotos(ls,l->arr + iVar8);
  goto LAB_0010d957;
}

Assistant:

static void statement (LexState *ls) {
  int line = ls->linenumber;  /* may be needed for error messages */
  enterlevel(ls);
  switch (ls->t.token) {
    case ';': {  /* stat -> ';' (empty statement) */
      luaX_next(ls);  /* skip ';' */
      break;
    }
    case TK_IF: {  /* stat -> ifstat */
      ifstat(ls, line);
      break;
    }
    case TK_WHILE: {  /* stat -> whilestat */
      whilestat(ls, line);
      break;
    }
    case TK_DO: {  /* stat -> DO block END */
      luaX_next(ls);  /* skip DO */
      block(ls);
      check_match(ls, TK_END, TK_DO, line);
      break;
    }
    case TK_FOR: {  /* stat -> forstat */
      forstat(ls, line);
      break;
    }
    case TK_REPEAT: {  /* stat -> repeatstat */
      repeatstat(ls, line);
      break;
    }
    case TK_FUNCTION: {  /* stat -> funcstat */
      funcstat(ls, line);
      break;
    }
    case TK_LOCAL: {  /* stat -> localstat */
      luaX_next(ls);  /* skip LOCAL */
      if (testnext(ls, TK_FUNCTION))  /* local function? */
        localfunc(ls);
      else
        localstat(ls);
      break;
    }
    case TK_DBCOLON: {  /* stat -> label */
      luaX_next(ls);  /* skip double colon */
      labelstat(ls, str_checkname(ls), line);
      break;
    }
    case TK_RETURN: {  /* stat -> retstat */
      luaX_next(ls);  /* skip RETURN */
      retstat(ls);
      break;
    }
    case TK_BREAK:   /* stat -> breakstat */
    case TK_GOTO: {  /* stat -> 'goto' NAME */
      gotostat(ls, luaK_jump(ls->fs));
      break;
    }
    default: {  /* stat -> func | assignment */
      exprstat(ls);
      break;
    }
  }
  lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
             ls->fs->freereg >= ls->fs->nactvar);
  ls->fs->freereg = ls->fs->nactvar;  /* free registers */
  leavelevel(ls);
}